

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

int __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::CustomModel_ParametersEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::GetCachedSize(MapEntryImpl<CoreML::Specification::CustomModel_ParametersEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_28;
  int local_24;
  int size;
  MapEntryImpl<CoreML::Specification::CustomModel_ParametersEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_local;
  
  bVar1 = has_key(this);
  if (bVar1) {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0xd])();
    local_24 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::GetCachedSize((MapEntryAccessorType *)CONCAT44(extraout_var,iVar2));
    local_24 = local_24 + 1;
  }
  else {
    local_24 = 0;
  }
  bVar1 = has_value(this);
  if (bVar1) {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0xe])();
    local_28 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::CustomModel_CustomModelParamValue>
               ::GetCachedSize((MapEntryAccessorType *)CONCAT44(extraout_var_00,iVar2));
    local_28 = local_28 + 1;
  }
  else {
    local_28 = 0;
  }
  return local_28 + local_24;
}

Assistant:

int GetCachedSize() const override {
    int size = 0;
    size += has_key() ? static_cast<int>(kTagSize) +
                            KeyTypeHandler::GetCachedSize(key())
                      : 0;
    size += has_value() ? static_cast<int>(kTagSize) +
                              ValueTypeHandler::GetCachedSize(value())
                        : 0;
    return size;
  }